

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

void soplex::SPxShellsort<int,soplex::Compare<double>>
               (int *keys,int end,Compare<double> *compare,int start)

{
  int iVar1;
  int i1;
  bool bVar2;
  int in_ECX;
  Compare<double> *in_RDX;
  int in_ESI;
  long in_RDI;
  double dVar3;
  int tempkey;
  int j;
  int i;
  int first;
  int h;
  int k;
  int local_30;
  int local_2c;
  int local_20;
  
  for (local_20 = 2; -1 < local_20; local_20 = local_20 + -1) {
    iVar1 = SPxShellsort<int,_soplex::Compare<double>_>::incs[local_20];
    for (local_2c = iVar1 + in_ECX; local_2c <= in_ESI; local_2c = local_2c + 1) {
      i1 = *(int *)(in_RDI + (long)local_2c * 4);
      local_30 = local_2c;
      while( true ) {
        bVar2 = false;
        if (iVar1 + in_ECX <= local_30) {
          dVar3 = Compare<double>::operator()
                            (in_RDX,i1,*(int *)(in_RDI + (long)(local_30 - iVar1) * 4));
          bVar2 = dVar3 < 0.0;
        }
        if (!bVar2) break;
        *(undefined4 *)(in_RDI + (long)local_30 * 4) =
             *(undefined4 *)(in_RDI + (long)(local_30 - iVar1) * 4);
        local_30 = local_30 - iVar1;
      }
      *(int *)(in_RDI + (long)local_30 * 4) = i1;
    }
  }
  return;
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}